

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O3

void Ssw_SmlSimulateOneFrame(Ssw_Sml_t *p)

{
  Aig_Obj_t *pObj;
  int iVar1;
  Aig_Man_t *pAVar2;
  uint uVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  timespec ts;
  timespec local_30;
  
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_30.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_30.tv_sec * -1000000;
  }
  pAVar2 = p->pAig;
  pVVar4 = pAVar2->vObjs;
  if (0 < pVVar4->nSize) {
    lVar7 = 0;
    do {
      pObj = (Aig_Obj_t *)pVVar4->pArray[lVar7];
      if ((pObj != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pObj->field_0x18 & 7) - 7)) {
        Ssw_SmlNodeSimulate(p,pObj,0);
        pAVar2 = p->pAig;
      }
      lVar7 = lVar7 + 1;
      pVVar4 = pAVar2->vObjs;
    } while (lVar7 < pVVar4->nSize);
  }
  if (0 < pAVar2->nRegs) {
    iVar1 = 0;
    do {
      uVar3 = pAVar2->nTruePos + iVar1;
      if (((int)uVar3 < 0) || (pAVar2->vCos->nSize <= (int)uVar3)) goto LAB_006b99b2;
      Ssw_SmlNodeCopyFanin(p,(Aig_Obj_t *)pAVar2->vCos->pArray[uVar3],0);
      iVar1 = iVar1 + 1;
      pAVar2 = p->pAig;
    } while (iVar1 < pAVar2->nRegs);
    if (0 < pAVar2->nRegs) {
      iVar1 = 0;
      do {
        uVar3 = pAVar2->nTruePos + iVar1;
        if (((((int)uVar3 < 0) || (pAVar2->vCos->nSize <= (int)uVar3)) ||
            (uVar6 = pAVar2->nTruePis + iVar1, (int)uVar6 < 0)) ||
           (pAVar2->vCis->nSize <= (int)uVar6)) {
LAB_006b99b2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        Ssw_SmlNodeTransferNext
                  (p,(Aig_Obj_t *)pAVar2->vCos->pArray[uVar3],
                   (Aig_Obj_t *)pAVar2->vCis->pArray[uVar6],0);
        iVar1 = iVar1 + 1;
        pAVar2 = p->pAig;
      } while (iVar1 < pAVar2->nRegs);
    }
  }
  iVar1 = clock_gettime(3,&local_30);
  if (iVar1 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_30.tv_nsec / 1000 + local_30.tv_sec * 1000000;
  }
  p->timeSim = p->timeSim + lVar7 + lVar5;
  p->nSimRounds = p->nSimRounds + 1;
  return;
}

Assistant:

void Ssw_SmlSimulateOneFrame( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    abctime clk;
clk = Abc_Clock();
    // simulate the nodes
    Aig_ManForEachNode( p->pAig, pObj, i )
        Ssw_SmlNodeSimulate( p, pObj, 0 );
    // copy simulation info into outputs
    Saig_ManForEachLi( p->pAig, pObj, i )
        Ssw_SmlNodeCopyFanin( p, pObj, 0 );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferNext( p, pObjLi, pObjLo, 0 );
p->timeSim += Abc_Clock() - clk;
p->nSimRounds++;
}